

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

CompiledMethod * __thiscall
Lodtalk::MethodAssembler::Assembler::generate
          (Assembler *this,size_t temporalCount,size_t argumentCount,bool hasPrimitive,
          size_t extraSize)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type literalCount_00;
  CompiledMethodHeader header;
  CompiledMethod *this_00;
  Oop *pOVar4;
  uint8_t *puVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar6;
  reference ppIVar7;
  undefined4 extraout_var;
  InstructionNode **instr;
  iterator __end2;
  iterator __begin2;
  vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
  *__range2;
  uint8_t *instructionBufferEnd;
  uint8_t *instructionBuffer;
  size_t i;
  Oop *literalData;
  CompiledMethod *compiledMethod;
  CompiledMethodHeader methodHeader;
  size_t extraFlags;
  unsigned_long methodSize;
  size_type literalCount;
  size_t instructionsSize;
  size_t extraSize_local;
  bool hasPrimitive_local;
  size_t argumentCount_local;
  size_t temporalCount_local;
  Assembler *this_local;
  
  sVar3 = computeInstructionsSize(this);
  literalCount_00 =
       std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::size(&this->literals);
  methodHeader.oop.field_0 = (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)0x0;
  if (hasPrimitive) {
    methodHeader.oop.field_0 = (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)0x20000;
  }
  header = CompiledMethodHeader::create
                     (literalCount_00,temporalCount,argumentCount,(size_t)methodHeader.oop.field_0);
  this_00 = CompiledMethod::newMethodWithHeader
                      (this->context,literalCount_00 * 8 + sVar3 + extraSize,header);
  pOVar4 = CompiledMethod::getFirstLiteralPointer(this_00);
  instructionBuffer = (uint8_t *)0x0;
  while( true ) {
    puVar5 = (uint8_t *)
             std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::size(&this->literals);
    if (puVar5 <= instructionBuffer) break;
    paVar6 = (anon_union_8_4_0eb573b0_for_Oop_0 *)
             std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::operator[]
                       (&this->literals,(size_type)instructionBuffer);
    pOVar4[(long)instructionBuffer].field_0 = *paVar6;
    instructionBuffer = instructionBuffer + 1;
  }
  instructionBufferEnd = CompiledMethod::getFirstBCPointer(this_00);
  puVar5 = instructionBufferEnd + sVar3;
  __end2 = std::
           vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
           ::begin(&this->instructionStream);
  instr = (InstructionNode **)
          std::
          vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
          ::end(&this->instructionStream);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
                                *)&instr);
    if (!bVar1) {
      if (instructionBufferEnd < puVar5) {
        printf("extra size %zu\n",(long)puVar5 - (long)instructionBufferEnd);
      }
      return this_00;
    }
    ppIVar7 = __gnu_cxx::
              __normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
              ::operator*(&__end2);
    iVar2 = (*(*ppIVar7)->_vptr_InstructionNode[3])(*ppIVar7,instructionBufferEnd);
    instructionBufferEnd = (uint8_t *)CONCAT44(extraout_var,iVar2);
    if (puVar5 < instructionBufferEnd) break;
    __gnu_cxx::
    __normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
    ::operator++(&__end2);
  }
  fprintf(_stderr,"Fatal error: Memory corruption\n");
  abort();
}

Assistant:

CompiledMethod *Assembler::generate(size_t temporalCount, size_t argumentCount, bool hasPrimitive, size_t extraSize)
{
	// Compute the method sizes.
	auto instructionsSize = computeInstructionsSize();
	auto literalCount = literals.size();
	auto methodSize = literalCount*sizeof(void*) + instructionsSize + extraSize;

	// Create the method header
    size_t extraFlags = 0;
    if(hasPrimitive)
        extraFlags |= CompiledMethodHeader::HasPrimitiveBit;

	auto methodHeader = CompiledMethodHeader::create(literalCount, temporalCount, argumentCount, extraFlags);

	// Create the compiled method
	auto compiledMethod = CompiledMethod::newMethodWithHeader(context, methodSize, methodHeader);

	// Set the compiled method literals
	auto literalData = compiledMethod->getFirstLiteralPointer();
	for(size_t i = 0; i < literals.size(); ++i)
		literalData[i] = literals[i].oop;

	// Encode the bytecode instructions.
	auto instructionBuffer = compiledMethod->getFirstBCPointer();
	auto instructionBufferEnd = instructionBuffer + instructionsSize;
	for(auto &instr : instructionStream)
	{
		instructionBuffer = instr->encode(instructionBuffer);
		if(instructionBuffer > instructionBufferEnd)
		{
			fprintf(stderr, "Fatal error: Memory corruption\n");
			abort();
		}
	}

    if(instructionBuffer < instructionBufferEnd)
        printf("extra size %zu\n", instructionBufferEnd - instructionBuffer);

	return compiledMethod;
}